

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

pair<HighsImplications::VarBound_*,_bool>
HighsHashTree<int,_HighsImplications::VarBound>::insert_recurse
          (NodePtr *insertNode,uint64_t hash,int hashPos,
          HighsHashTableEntry<int,_HighsImplications::VarBound> *entry)

{
  int *piVar1;
  unsigned_long *puVar2;
  byte bVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  int i;
  InnerLeaf<1> *this;
  ValueType *pVVar9;
  uint uVar8;
  long lVar10;
  undefined8 *puVar11;
  sbyte sVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar14;
  int iVar13;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  ulong uVar15;
  undefined8 extraout_RDX_03;
  int i_2;
  undefined8 *puVar16;
  int i_1;
  int hashPos_00;
  ulong uVar17;
  uint numChilds;
  long lVar18;
  ulong uVar19;
  Entry *pEVar20;
  int i_4;
  InnerLeaf<4> *this_00;
  BranchNode *pBVar21;
  long lVar22;
  pair<HighsImplications::VarBound_*,_bool> pVar23;
  pair<HighsImplications::VarBound_*,_bool> pVar24;
  pair<HighsImplications::VarBound_*,_bool> pVar25;
  ulong uStack_b0;
  undefined8 local_70;
  array<unsigned_char,_55UL> sizes;
  
  uVar19 = insertNode->ptrAndType;
  switch((uint)uVar19 & 7) {
  case 0:
    if (hashPos != 9) {
      this = (InnerLeaf<1> *)operator_new(0xd8);
      (this->occupation).occupation = 0;
      this->size = 0;
      (this->hashes)._M_elems[0] = 0;
      insertNode->ptrAndType = (ulong)this | 2;
      pVar23 = InnerLeaf<1>::insert_entry(this,hash,hashPos,entry);
      return pVar23;
    }
    puVar11 = (undefined8 *)operator_new(0x28);
    *puVar11 = 0;
    dVar4 = (entry->value_).coef;
    puVar11[1] = *(undefined8 *)entry;
    puVar11[2] = dVar4;
    puVar11[3] = (entry->value_).constant;
    *(undefined4 *)(puVar11 + 4) = 1;
    insertNode->ptrAndType = (ulong)puVar11 | 1;
    uVar14 = extraout_RDX;
    goto LAB_002b234f;
  case 1:
    puVar11 = (undefined8 *)(uVar19 & 0xfffffffffffffff8);
    do {
      puVar16 = puVar11;
      if (*(int *)(puVar16 + 1) == entry->key_) {
        uVar14 = 0;
        goto LAB_002b244f;
      }
      puVar11 = (undefined8 *)*puVar16;
    } while ((undefined8 *)*puVar16 != (undefined8 *)0x0);
    puVar11 = (undefined8 *)operator_new(0x20);
    *puVar11 = 0;
    dVar4 = (entry->value_).coef;
    puVar11[1] = *(undefined8 *)entry;
    puVar11[2] = dVar4;
    puVar11[3] = (entry->value_).constant;
    *puVar16 = puVar11;
    piVar1 = (int *)((undefined8 *)(uVar19 & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    uVar14 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
    puVar16 = puVar11;
LAB_002b244f:
    pVar24._8_8_ = uVar14;
    pVar24.first = (VarBound *)(puVar16 + 2);
    break;
  case 2:
    pVar24 = insert_into_leaf<1>(insertNode,(InnerLeaf<1> *)(uVar19 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 3:
    pVar24 = insert_into_leaf<2>(insertNode,(InnerLeaf<2> *)(uVar19 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 4:
    pVar24 = insert_into_leaf<3>(insertNode,(InnerLeaf<3> *)(uVar19 & 0xfffffffffffffff8),hash,
                                 hashPos,entry);
    break;
  case 5:
    this_00 = (InnerLeaf<4> *)(uVar19 & 0xfffffffffffffff8);
    if (this_00->size < 0x36) {
      pVar23 = InnerLeaf<4>::insert_entry(this_00,hash,hashPos,entry);
      return pVar23;
    }
    pVVar9 = InnerLeaf<4>::find_entry(this_00,hash,hashPos,&entry->key_);
    if (pVVar9 != (ValueType *)0x0) {
      pVar23._8_8_ = 0;
      pVar23.first = pVVar9;
      return pVar23;
    }
    uVar8 = (uint)(hash >> ((char)hashPos * -6 + 0x3aU & 0x3f)) & 0x3f;
    uVar19 = (this_00->occupation).occupation | 1L << (ulong)uVar8;
    lVar18 = POPCOUNT(uVar19);
    numChilds = (uint)lVar18;
    pBVar21 = createBranchingNode(numChilds);
    insertNode->ptrAndType = (ulong)pBVar21 | 6;
    (pBVar21->occupation).occupation = uVar19;
    hashPos_00 = hashPos + 1;
    sVar12 = (sbyte)uVar8;
    if (hashPos_00 != 9) {
      if (numChilds < 2) {
        insertNode = pBVar21->child;
        pBVar21->child[0].ptrAndType = (ulong)this_00 | 5;
        InnerLeaf<4>::rehash(this_00,hashPos_00);
      }
      else {
        uVar8 = this_00->size;
        local_70 = (ulong)uVar8;
        iVar13 = (uVar8 - numChilds) + 2;
        if (iVar13 < 7) {
          for (lVar10 = 0; lVar18 != lVar10; lVar10 = lVar10 + 1) {
            puVar11 = (undefined8 *)operator_new(0xd8);
            *puVar11 = 0;
            *(undefined4 *)(puVar11 + 1) = 0;
            puVar11[2] = 0;
            pBVar21->child[lVar10].ptrAndType = (ulong)puVar11 | 2;
          }
          pEVar20 = (this_00->entries)._M_elems;
          uVar17 = local_70;
          for (lVar18 = 0; lVar18 < (int)uVar17; lVar18 = lVar18 + 1) {
            InnerLeaf<1>::insert_entry
                      ((InnerLeaf<1> *)
                       (pBVar21->child
                        [POPCOUNT(uVar19 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar18] >> 10)
                                            & 0x3f)) + -1].ptrAndType & 0xfffffffffffffff8),
                       (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20
                       ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,
                       hashPos_00,pEVar20);
            uVar17 = (ulong)(uint)this_00->size;
            pEVar20 = pEVar20 + 1;
          }
          operator_delete(this_00);
          pVar25 = InnerLeaf<1>::insert_entry
                             ((InnerLeaf<1> *)
                              (pBVar21->child[POPCOUNT(uVar19 >> sVar12) + -1].ptrAndType &
                              0xfffffffffffffff8),hash,hashPos_00,entry);
          hashPos_00 = hashPos;
        }
        else {
          sizes._M_elems[0x20] = '\0';
          sizes._M_elems[0x21] = '\0';
          sizes._M_elems[0x22] = '\0';
          sizes._M_elems[0x23] = '\0';
          sizes._M_elems[0x24] = '\0';
          sizes._M_elems[0x25] = '\0';
          sizes._M_elems[0x26] = '\0';
          sizes._M_elems[0x27] = '\0';
          sizes._M_elems[0x28] = '\0';
          sizes._M_elems[0x29] = '\0';
          sizes._M_elems[0x2a] = '\0';
          sizes._M_elems[0x2b] = '\0';
          sizes._M_elems[0x2c] = '\0';
          sizes._M_elems[0x2d] = '\0';
          sizes._M_elems[0x2e] = '\0';
          sizes._M_elems[0x10] = '\0';
          sizes._M_elems[0x11] = '\0';
          sizes._M_elems[0x12] = '\0';
          sizes._M_elems[0x13] = '\0';
          sizes._M_elems[0x14] = '\0';
          sizes._M_elems[0x15] = '\0';
          sizes._M_elems[0x16] = '\0';
          sizes._M_elems[0x17] = '\0';
          sizes._M_elems[0x18] = '\0';
          sizes._M_elems[0x19] = '\0';
          sizes._M_elems[0x1a] = '\0';
          sizes._M_elems[0x1b] = '\0';
          sizes._M_elems[0x1c] = '\0';
          sizes._M_elems[0x1d] = '\0';
          sizes._M_elems[0x1e] = '\0';
          sizes._M_elems[0x1f] = '\0';
          sizes._M_elems[0] = '\0';
          sizes._M_elems[1] = '\0';
          sizes._M_elems[2] = '\0';
          sizes._M_elems[3] = '\0';
          sizes._M_elems[4] = '\0';
          sizes._M_elems[5] = '\0';
          sizes._M_elems[6] = '\0';
          sizes._M_elems[7] = '\0';
          sizes._M_elems[8] = '\0';
          sizes._M_elems[9] = '\0';
          sizes._M_elems[10] = '\0';
          sizes._M_elems[0xb] = '\0';
          sizes._M_elems[0xc] = '\0';
          sizes._M_elems[0xd] = '\0';
          sizes._M_elems[0xe] = '\0';
          sizes._M_elems[0xf] = '\0';
          sizes._M_elems[0x2f] = '\0';
          sizes._M_elems[0x30] = '\0';
          sizes._M_elems[0x31] = '\0';
          sizes._M_elems[0x32] = '\0';
          sizes._M_elems[0x33] = '\0';
          sizes._M_elems[0x34] = '\0';
          sizes._M_elems[0x35] = '\0';
          sizes._M_elems[0x36] = '\0';
          sizes._M_elems[POPCOUNT(uVar19 >> sVar12) + -1] =
               sizes._M_elems[POPCOUNT(uVar19 >> sVar12) + -1] + '\x01';
          uVar17 = 0;
          uVar15 = 0;
          if (0 < (int)uVar8) {
            uVar15 = (ulong)uVar8;
          }
          for (; uVar15 != uVar17; uVar17 = uVar17 + 1) {
            sizes._M_elems
            [POPCOUNT(uVar19 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar17] >> 10) & 0x3f)) +
             -1] = sizes._M_elems
                   [POPCOUNT(uVar19 >> ((byte)((uint)(this_00->hashes)._M_elems[uVar17] >> 10) &
                                       0x3f)) + -1] + '\x01';
          }
          for (lVar10 = 0; lVar18 != lVar10; lVar10 = lVar10 + 1) {
            switch(sizes._M_elems[lVar10] + 9 >> 4) {
            case 0:
              puVar11 = (undefined8 *)operator_new(0xd8);
              uStack_b0 = 2;
              break;
            case 1:
              puVar11 = (undefined8 *)operator_new(0x2d8);
              uStack_b0 = 3;
              break;
            case 2:
              puVar11 = (undefined8 *)operator_new(0x4d8);
              uStack_b0 = 4;
              break;
            case 3:
              puVar11 = (undefined8 *)operator_new(0x6d8);
              uStack_b0 = 5;
              break;
            default:
              goto switchD_002b2894_default;
            }
            *puVar11 = 0;
            *(undefined4 *)(puVar11 + 1) = 0;
            puVar11[2] = 0;
            pBVar21->child[lVar10].ptrAndType = uStack_b0 | (ulong)puVar11;
switchD_002b2894_default:
          }
          pEVar20 = (this_00->entries)._M_elems;
          uVar17 = local_70;
          for (lVar18 = 0; lVar18 < (int)uVar17; lVar18 = lVar18 + 1) {
            uVar17 = pBVar21->child
                     [POPCOUNT(uVar19 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar18] >> 10) &
                                         0x3f)) + -1].ptrAndType;
            switch((uint)uVar17 & 7) {
            case 2:
              InnerLeaf<1>::insert_entry
                        ((InnerLeaf<1> *)(uVar17 & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,hashPos_00,pEVar20);
              break;
            case 3:
              InnerLeaf<2>::insert_entry
                        ((InnerLeaf<2> *)(uVar17 & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,hashPos_00,pEVar20);
              break;
            case 4:
              InnerLeaf<3>::insert_entry
                        ((InnerLeaf<3> *)(uVar17 & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,hashPos_00,pEVar20);
              break;
            case 5:
              InnerLeaf<4>::insert_entry
                        ((InnerLeaf<4> *)(uVar17 & 0xfffffffffffffff8),
                         (ulong)(uint)pEVar20->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >>
                         0x20 ^ (ulong)(uint)pEVar20->key_ * -0x75e7c76a1153eaca +
                                0x1da24fc66dd63e32,hashPos_00,pEVar20);
            }
            uVar17 = (ulong)(uint)this_00->size;
            pEVar20 = pEVar20 + 1;
          }
          operator_delete(this_00);
          pVar25._8_8_ = extraout_RDX_03;
          pVar25.first = (VarBound *)pEVar20;
          insertNode = pBVar21->child + POPCOUNT(uVar19 >> sVar12) + -1;
        }
        if (iVar13 < 7) {
          return pVar25;
        }
      }
      goto LAB_002b24e2;
    }
    for (lVar10 = 0; lVar18 != lVar10; lVar10 = lVar10 + 1) {
      pBVar21->child[lVar10].ptrAndType = 0;
    }
    lVar18 = 0x39;
    for (lVar10 = 0; lVar10 < this_00->size; lVar10 = lVar10 + 1) {
      lVar22 = POPCOUNT(uVar19 >> ((byte)((uint)(this_00->hashes)._M_elems[lVar10] >> 10) & 0x3f));
      uVar17 = pBVar21->child[lVar22 + -1].ptrAndType;
      if ((uVar17 & 7) == 0) {
        puVar11 = (undefined8 *)operator_new(0x28);
        *puVar11 = 0;
        puVar2 = (this_00->hashes)._M_elems + lVar18 + -2;
        uVar7 = puVar2[1];
        puVar11[1] = *puVar2;
        puVar11[2] = uVar7;
        puVar11[3] = (this_00->hashes)._M_elems[lVar18];
        *(undefined4 *)(puVar11 + 4) = 1;
        pBVar21->child[lVar22 + -1].ptrAndType = (ulong)puVar11 | 1;
      }
      else {
        puVar16 = (undefined8 *)(uVar17 & 0xfffffffffffffff8);
        puVar11 = (undefined8 *)operator_new(0x20);
        uVar14 = *puVar16;
        uVar5 = puVar16[1];
        uVar6 = puVar16[3];
        puVar11[2] = puVar16[2];
        puVar11[3] = uVar6;
        *puVar11 = uVar14;
        puVar11[1] = uVar5;
        *puVar16 = puVar11;
        puVar16[3] = (this_00->hashes)._M_elems[lVar18];
        puVar2 = (this_00->hashes)._M_elems + lVar18 + -2;
        uVar7 = puVar2[1];
        puVar16[1] = *puVar2;
        puVar16[2] = uVar7;
        *(int *)(puVar16 + 4) = *(int *)(puVar16 + 4) + 1;
      }
      lVar18 = lVar18 + 3;
    }
    operator_delete(this_00);
    uVar17 = pBVar21->child[POPCOUNT(uVar19 >> sVar12) + -1].ptrAndType;
    if ((uVar17 & 7) == 0) {
      puVar11 = (undefined8 *)operator_new(0x28);
      *puVar11 = 0;
      dVar4 = (entry->value_).coef;
      puVar11[1] = *(undefined8 *)entry;
      puVar11[2] = dVar4;
      puVar11[3] = (entry->value_).constant;
      *(undefined4 *)(puVar11 + 4) = 1;
      pBVar21->child[POPCOUNT(uVar19 >> sVar12) + -1].ptrAndType = (ulong)puVar11 | 1;
      uVar14 = extraout_RDX_02;
    }
    else {
      puVar11 = (undefined8 *)(uVar17 & 0xfffffffffffffff8);
      puVar16 = (undefined8 *)operator_new(0x20);
      uVar14 = *puVar11;
      uVar5 = puVar11[1];
      uVar6 = puVar11[3];
      puVar16[2] = puVar11[2];
      puVar16[3] = uVar6;
      *puVar16 = uVar14;
      puVar16[1] = uVar5;
      *puVar11 = puVar16;
      puVar11[3] = (entry->value_).constant;
      dVar4 = (entry->value_).coef;
      puVar11[1] = *(undefined8 *)entry;
      puVar11[2] = dVar4;
      *(int *)(puVar11 + 4) = *(int *)(puVar11 + 4) + 1;
      uVar14 = extraout_RDX_01;
    }
LAB_002b234f:
    pVar24._9_7_ = (int7)((ulong)uVar14 >> 8);
    pVar24.second = true;
    pVar24.first = (VarBound *)(puVar11 + 2);
    break;
  case 6:
    uVar17 = hash >> ((char)hashPos * -6 + 0x3aU & 0x3f);
    pBVar21 = (BranchNode *)(uVar19 & 0xfffffffffffffff8);
    uVar19 = (pBVar21->occupation).occupation;
    bVar3 = (byte)uVar17;
    lVar18 = POPCOUNT(uVar19 >> (bVar3 & 0x3f));
    if ((uVar19 >> (uVar17 & 0x3f) & 1) == 0) {
      pBVar21 = addChildToBranchNode(pBVar21,bVar3 & 0x3f,(int)lVar18);
      pBVar21->child[lVar18].ptrAndType = 0;
      (pBVar21->occupation).occupation = (pBVar21->occupation).occupation | 1L << (bVar3 & 0x3f);
    }
    else {
      lVar18 = lVar18 + -1;
    }
    insertNode->ptrAndType = (ulong)pBVar21 | 6;
    hashPos_00 = hashPos + 1;
    insertNode = pBVar21->child + lVar18;
    goto LAB_002b24e2;
  case 7:
    hashPos_00 = hashPos;
LAB_002b24e2:
    pVar24 = insert_recurse(insertNode,hash,hashPos_00,entry);
  }
  return pVar24;
}

Assistant:

static std::pair<ValueType*, bool> insert_recurse(
      NodePtr* insertNode, uint64_t hash, int hashPos,
      HighsHashTableEntry<K, V>& entry) {
    switch (insertNode->getType()) {
      case kEmpty: {
        if (hashPos == kMaxDepth) {
          ListLeaf* leaf = new ListLeaf(std::move(entry));
          *insertNode = leaf;
          return std::make_pair(&leaf->first.entry.value(), true);
        } else {
          InnerLeaf<1>* leaf = new InnerLeaf<1>;
          *insertNode = leaf;
          return leaf->insert_entry(hash, hashPos, entry);
        }
      }
      case kListLeaf: {
        ListLeaf* leaf = insertNode->getListLeaf();
        ListNode* iter = &leaf->first;
        while (true) {
          // check for existing key
          if (iter->entry.key() == entry.key())
            return std::make_pair(&iter->entry.value(), false);

          if (iter->next == nullptr) {
            // reached the end of the list and key is not duplicate, so insert
            iter->next = new ListNode(std::move(entry));
            ++leaf->count;
            return std::make_pair(&iter->next->entry.value(), true);
          }
          iter = iter->next;
        }

        break;
      }
      case kInnerLeafSizeClass1:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass1(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass2:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass2(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass3:
        return insert_into_leaf(insertNode,
                                insertNode->getInnerLeafSizeClass3(), hash,
                                hashPos, entry);
        break;
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = insertNode->getInnerLeafSizeClass4();
        if (leaf->size < InnerLeaf<4>::capacity())
          return leaf->insert_entry(hash, hashPos, entry);

        auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
        if (existingEntry) return std::make_pair(existingEntry, false);
        Occupation occupation = leaf->occupation;

        uint8_t hashChunk = get_hash_chunk(hash, hashPos);
        occupation.set(hashChunk);

        int branchSize = occupation.num_set();

        BranchNode* branch = createBranchingNode(branchSize);
        *insertNode = branch;
        branch->occupation = occupation;

        if (hashPos + 1 == kMaxDepth) {
          for (int i = 0; i < branchSize; ++i) branch->child[i] = nullptr;

          for (int i = 0; i < leaf->size; ++i) {
            int pos =
                occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                1;
            if (branch->child[pos].getType() == kEmpty)
              branch->child[pos] = new ListLeaf(std::move(leaf->entries[i]));
            else {
              ListLeaf* listLeaf = branch->child[pos].getListLeaf();
              ListNode* newNode = new ListNode(std::move(listLeaf->first));
              listLeaf->first.next = newNode;
              listLeaf->first.entry = std::move(leaf->entries[i]);
              ++listLeaf->count;
            }
          }

          delete leaf;

          ListLeaf* listLeaf;

          int pos = occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
          if (branch->child[pos].getType() == kEmpty) {
            listLeaf = new ListLeaf(std::move(entry));
            branch->child[pos] = listLeaf;
          } else {
            listLeaf = branch->child[pos].getListLeaf();
            ListNode* newNode = new ListNode(std::move(listLeaf->first));
            listLeaf->first.next = newNode;
            listLeaf->first.entry = std::move(entry);
            ++listLeaf->count;
          }

          return std::make_pair(&listLeaf->first.entry.value(), true);
        }

        if (branchSize > 1) {
          // maxsize in one bucket = number of items - (num buckets-1)
          // since each bucket has at least 1 item the largest one can only
          // have all remaining ones After adding the item: If it does not
          // collide
          int maxEntriesPerLeaf = 2 + leaf->size - branchSize;

          if (maxEntriesPerLeaf <= InnerLeaf<1>::capacity()) {
            // all items can go into the smallest leaf size
            for (int i = 0; i < branchSize; ++i)
              branch->child[i] = new InnerLeaf<1>;

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                  compute_hash(leaf->entries[i].key()), hashPos + 1,
                  leaf->entries[i]);
            }

            delete leaf;

            int pos =
                occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
            return branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                hash, hashPos + 1, entry);
          } else {
            // there are many collisions, determine the exact sizes first
            std::array<uint8_t, InnerLeaf<4>::capacity() + 1> sizes = {};
            sizes[occupation.num_set_until(hashChunk) - 1] += 1;
            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;
              sizes[pos] += 1;
            }

            for (int i = 0; i < branchSize; ++i) {
              switch (entries_to_size_class(sizes[i])) {
                case 1:
                  branch->child[i] = new InnerLeaf<1>;
                  break;
                case 2:
                  branch->child[i] = new InnerLeaf<2>;
                  break;
                case 3:
                  branch->child[i] = new InnerLeaf<3>;
                  break;
                case 4:
                  branch->child[i] = new InnerLeaf<4>;
                  break;
                default:
                  // Unexpected result from 'entries_to_size_class'
                  assert(false);
              }
            }

            for (int i = 0; i < leaf->size; ++i) {
              int pos =
                  occupation.num_set_until(get_first_chunk16(leaf->hashes[i])) -
                  1;

              switch (branch->child[pos].getType()) {
                case kInnerLeafSizeClass1:
                  branch->child[pos].getInnerLeafSizeClass1()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass2:
                  branch->child[pos].getInnerLeafSizeClass2()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass3:
                  branch->child[pos].getInnerLeafSizeClass3()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                case kInnerLeafSizeClass4:
                  branch->child[pos].getInnerLeafSizeClass4()->insert_entry(
                      compute_hash(leaf->entries[i].key()), hashPos + 1,
                      leaf->entries[i]);
                  break;
                default:
                  break;
              }
            }
          }

          delete leaf;

          int pos = occupation.num_set_until(hashChunk) - 1;
          insertNode = &branch->child[pos];
          ++hashPos;
        } else {
          // extremely unlikely that the new branch node only gets one
          // child in that case create it and defer the insertion into
          // the next depth
          branch->child[0] = leaf;
          insertNode = &branch->child[0];
          ++hashPos;
          leaf->rehash(hashPos);
        }

        break;
      }
      case kBranchNode: {
        BranchNode* branch = insertNode->getBranchNode();

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos));

        if (branch->occupation.test(get_hash_chunk(hash, hashPos))) {
          --location;
        } else {
          branch = addChildToBranchNode(branch, get_hash_chunk(hash, hashPos),
                                        location);

          branch->child[location] = nullptr;
          branch->occupation.set(get_hash_chunk(hash, hashPos));
        }

        *insertNode = branch;
        insertNode = &branch->child[location];
        ++hashPos;
      }
    }

    return insert_recurse(insertNode, hash, hashPos, entry);
  }